

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestPackage.cpp
# Opt level: O1

void __thiscall tcu::TestPackageRegistry::~TestPackageRegistry(TestPackageRegistry *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  PackageInfo *pPVar2;
  long *plVar3;
  pointer ppPVar4;
  long lVar5;
  
  ppPVar4 = (this->m_packageInfos).
            super__Vector_base<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_packageInfos).
                              super__Vector_base<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar4) >> 3)) {
    lVar5 = 0;
    do {
      pPVar2 = ppPVar4[lVar5];
      if (pPVar2 != (PackageInfo *)0x0) {
        plVar3 = *(long **)&(pPVar2->name)._M_dataplus;
        paVar1 = &(pPVar2->name).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar3 != paVar1) {
          operator_delete(plVar3,paVar1->_M_allocated_capacity + 1);
        }
        operator_delete(pPVar2,0x28);
      }
      lVar5 = lVar5 + 1;
      ppPVar4 = (this->m_packageInfos).
                super__Vector_base<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar5 < (int)((ulong)((long)(this->m_packageInfos).
                                         super__Vector_base<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar4)
                          >> 3));
  }
  if (ppPVar4 != (pointer)0x0) {
    operator_delete(ppPVar4,(long)(this->m_packageInfos).
                                  super__Vector_base<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppPVar4
                   );
    return;
  }
  return;
}

Assistant:

TestPackageRegistry::~TestPackageRegistry (void)
{
	for (int i = 0; i < (int)m_packageInfos.size(); i++)
		delete m_packageInfos[i];
}